

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemerror.cpp
# Opt level: O1

QString * standardLibraryErrorString(QString *__return_storage_ptr__,int errorCode)

{
  char *pcVar1;
  bool bVar2;
  DataPointer *pDVar3;
  Data *pDVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  QString *in_RCX;
  char *pcVar8;
  QString *pQVar9;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_58;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)0x0;
  local_38.d.ptr = (char16_t *)0x0;
  local_38.d.size = 0;
  bVar2 = true;
  if (errorCode < 0xd) {
    if (errorCode != 0) {
      if (errorCode == 2) {
        pcVar8 = "No such file or directory";
        goto LAB_0011831e;
      }
LAB_00118322:
      pcVar8 = strerror(errorCode);
      if (pcVar8 == (char *)0x0) {
        pQVar9 = (QString *)0x0;
      }
      else {
        pQVar9 = (QString *)0xffffffffffffffff;
        do {
          in_RCX = (QString *)((long)&(pQVar9->d).d + 1);
          pcVar1 = pcVar8 + 1 + (long)pQVar9;
          pQVar9 = in_RCX;
        } while (*pcVar1 != '\0');
      }
      ba.m_data = (storage_type *)in_RCX;
      ba.m_size = (qsizetype)pcVar8;
      QString::fromLocal8Bit(&local_58,pQVar9,ba);
      pcVar7 = local_38.d.ptr;
      pDVar6 = local_38.d.d;
      in_RCX = (QString *)local_58.d.size;
      pDVar4 = local_58.d.d;
      local_58.d.d = local_38.d.d;
      local_38.d.d = pDVar4;
      local_38.d.ptr = local_58.d.ptr;
      local_58.d.ptr = pcVar7;
      local_58.d.size = local_38.d.size;
      local_38.d.size = (qsizetype)in_RCX;
      if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
        }
      }
    }
    pcVar8 = (char *)0x0;
  }
  else {
    if (errorCode == 0x1c) {
      pcVar8 = "No space left on device";
    }
    else if (errorCode == 0x18) {
      pcVar8 = "Too many open files";
    }
    else {
      if (errorCode != 0xd) goto LAB_00118322;
      pcVar8 = "Permission denied";
    }
LAB_0011831e:
    bVar2 = false;
  }
  if (!bVar2) {
    pQVar9 = (QString *)0xffffffffffffffff;
    do {
      pDVar3 = &pQVar9->d;
      pQVar9 = (QString *)((long)&(pQVar9->d).d + 1);
    } while ((pcVar8 + 1)[(long)&pDVar3->d] != '\0');
    ba_00.m_data = (storage_type *)in_RCX;
    ba_00.m_size = (qsizetype)pcVar8;
    QString::fromLatin1(&local_58,pQVar9,ba_00);
    pcVar7 = local_38.d.ptr;
    pDVar6 = local_38.d.d;
    qVar5 = local_58.d.size;
    pDVar4 = local_58.d.d;
    local_58.d.d = local_38.d.d;
    local_38.d.d = pDVar4;
    local_38.d.ptr = local_58.d.ptr;
    local_58.d.ptr = pcVar7;
    local_58.d.size = local_38.d.size;
    local_38.d.size = qVar5;
    if (&pDVar6->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar6->super_QArrayData,2,0x10);
      }
    }
  }
  QString::trimmed_helper(__return_storage_ptr__,&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QString standardLibraryErrorString(int errorCode)
{
    const char *s = nullptr;
    QString ret;
    switch (errorCode) {
    case 0:
        break;
    case EACCES:
        s = QT_TRANSLATE_NOOP("QIODevice", "Permission denied");
        break;
    case EMFILE:
        s = QT_TRANSLATE_NOOP("QIODevice", "Too many open files");
        break;
    case ENOENT:
        s = QT_TRANSLATE_NOOP("QIODevice", "No such file or directory");
        break;
    case ENOSPC:
        s = QT_TRANSLATE_NOOP("QIODevice", "No space left on device");
        break;
    default: {
      #if QT_CONFIG(thread) && defined(_POSIX_THREAD_SAFE_FUNCTIONS) && _POSIX_VERSION >= 200112L && !defined(Q_OS_INTEGRITY) && !defined(Q_OS_QNX)
            QByteArray buf(1024, Qt::Uninitialized);
            ret = fromstrerror_helper(strerror_r(errorCode, buf.data(), buf.size()), buf);
      #else
            ret = QString::fromLocal8Bit(strerror(errorCode));
      #endif
    break; }
    }
    if (s) {
#ifndef QT_BOOTSTRAPPED
        ret = QCoreApplication::translate("QIODevice", s);
#else
        ret = QString::fromLatin1(s);
#endif
    }
    return ret.trimmed();
}